

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

QString * buttonDefaultText(QString *__return_storage_ptr__,int wstyle,int which,
                           QWizardPrivate *wizardPrivate)

{
  QString *in_RAX;
  QString *pQVar1;
  int iVar2;
  
  switch(which) {
  case 0:
    if (wstyle == 2) {
      iVar2 = 0x6e984b;
    }
    else {
      iVar2 = 0x6e9853;
    }
    break;
  case 1:
    if (wstyle == 2) {
      iVar2 = 0x6e985b;
    }
    else {
      iVar2 = 0x6e9864;
    }
    break;
  case 2:
    iVar2 = 0x6e986c;
    break;
  case 3:
    if (wstyle == 2) {
      iVar2 = 0x6e9873;
    }
    else {
      iVar2 = 0x6e9878;
    }
    break;
  case 4:
    iVar2 = 0x6e8854;
    break;
  case 5:
    if (wstyle == 2) {
      iVar2 = 0x6e9881;
    }
    else {
      iVar2 = 0x6e9880;
    }
    break;
  default:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return in_RAX;
  }
  pQVar1 = (QString *)
           QMetaObject::tr((char *)__return_storage_ptr__,(char *)&QWizard::staticMetaObject,iVar2);
  return pQVar1;
}

Assistant:

static QString buttonDefaultText(int wstyle, int which, const QWizardPrivate *wizardPrivate)
{
#if !QT_CONFIG(style_windowsvista)
    Q_UNUSED(wizardPrivate);
#endif
    const bool macStyle = (wstyle == QWizard::MacStyle);
    switch (which) {
    case QWizard::BackButton:
        return macStyle ? QWizard::tr("Go Back") : QWizard::tr("< &Back");
    case QWizard::NextButton:
        if (macStyle)
            return QWizard::tr("Continue");
        else
            return wizardPrivate->isVistaThemeEnabled()
                ? QWizard::tr("&Next") : QWizard::tr("&Next >");
    case QWizard::CommitButton:
        return QWizard::tr("Commit");
    case QWizard::FinishButton:
        return macStyle ? QWizard::tr("Done") : QWizard::tr("&Finish");
    case QWizard::CancelButton:
        return QWizard::tr("Cancel");
    case QWizard::HelpButton:
        return macStyle ? QWizard::tr("Help") : QWizard::tr("&Help");
    default:
        return QString();
    }
}